

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  int iVar1;
  size_t __n;
  long lVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = X->n * 8;
  __n = buflen + X->n * -8;
  if (buflen < uVar7 || __n == 0) {
    lVar2 = buflen * 8;
    iVar1 = -8;
    sVar4 = buflen;
    do {
      uVar5 = buflen;
      if (uVar7 == sVar4) goto LAB_00106cc4;
      uVar5 = sVar4 & 0xfffffffffffffff8;
      bVar3 = (byte)lVar2;
      sVar4 = sVar4 + 1;
      lVar2 = lVar2 + 8;
    } while ((char)(*(ulong *)((long)X->p + uVar5) >> (bVar3 & 0x38)) == '\0');
  }
  else {
    memset(buf,0,__n);
    uVar5 = uVar7;
LAB_00106cc4:
    if (buflen <= uVar7) {
      buflen = uVar7;
    }
    iVar1 = 0;
    bVar3 = 0;
    uVar6 = 0;
    while (uVar5 != 0) {
      buf[uVar5 + buflen + ~uVar7] =
           (uchar)(*(ulong *)((long)X->p + (uVar6 & 0xfffffffffffffff8)) >> (bVar3 & 0x38));
      uVar6 = uVar6 + 1;
      bVar3 = bVar3 + 8;
      uVar5 = uVar5 - 1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X,
                              unsigned char *buf, size_t buflen )
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;
    size_t i;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    stored_bytes = X->n * ciL;

    if( stored_bytes < buflen )
    {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = buf + buflen - stored_bytes;
        memset( buf, 0, buflen - stored_bytes );
    }
    else
    {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = buflen;
        p = buf;
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        p[bytes_to_copy - i - 1] = GET_BYTE( X, i );

    return( 0 );
}